

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O1

CURLcode Curl_resolver_wait_resolv(connectdata *conn,Curl_dns_entry **entry)

{
  _Bool _Var1;
  void *pvVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  
  iVar3 = Curl_thread_join((pthread_t **)(conn->async).os_specific);
  if (iVar3 == 0) {
    CVar4 = CURLE_OK;
  }
  else {
    pvVar2 = (conn->async).os_specific;
    CVar4 = Curl_addrinfo_callback
                      (conn,*(int *)((long)pvVar2 + 0x34),*(Curl_addrinfo **)((long)pvVar2 + 0x38));
    *(undefined8 *)((long)pvVar2 + 0x38) = 0;
  }
  (conn->async).done = true;
  if (entry != (Curl_dns_entry **)0x0) {
    *entry = (conn->async).dns;
  }
  if ((conn->async).dns == (Curl_dns_entry *)0x0) {
    _Var1 = (conn->bits).httpproxy;
    pcVar5 = "host";
    if (_Var1 != false) {
      pcVar5 = "proxy";
    }
    CVar4 = CURLE_COULDNT_RESOLVE_HOST - _Var1;
    Curl_failf(conn->data,"Could not resolve %s: %s",pcVar5,(conn->async).hostname);
  }
  destroy_async_data(&conn->async);
  if ((conn->async).dns == (Curl_dns_entry *)0x0) {
    Curl_conncontrol(conn,1);
  }
  return CVar4;
}

Assistant:

CURLcode Curl_resolver_wait_resolv(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  struct thread_data   *td = (struct thread_data*) conn->async.os_specific;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(conn && td);

  /* wait for the thread to resolve the name */
  if(Curl_thread_join(&td->thread_hnd))
    result = getaddrinfo_complete(conn);
  else
    DEBUGASSERT(0);

  conn->async.done = TRUE;

  if(entry)
    *entry = conn->async.dns;

  if(!conn->async.dns)
    /* a name was not resolved, report error */
    result = resolver_error(conn);

  destroy_async_data(&conn->async);

  if(!conn->async.dns)
    connclose(conn, "asynch resolve failed");

  return result;
}